

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldInsertionIteratorsTest_MoveStrings_Test::
~RepeatedPtrFieldInsertionIteratorsTest_MoveStrings_Test
          (RepeatedPtrFieldInsertionIteratorsTest_MoveStrings_Test *this)

{
  pointer ppTVar1;
  long lVar2;
  
  (this->super_RepeatedPtrFieldInsertionIteratorsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__RepeatedPtrFieldInsertionIteratorsTest_018bb7a8;
  proto2_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_RepeatedPtrFieldInsertionIteratorsTest).protobuffer_);
  ppTVar1 = (this->super_RepeatedPtrFieldInsertionIteratorsTest).nested_ptrs_.
            super__Vector_base<proto2_unittest::TestAllTypes_NestedMessage_*,_std::allocator<proto2_unittest::TestAllTypes_NestedMessage_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar1 != (pointer)0x0) {
    operator_delete(ppTVar1,(long)(this->super_RepeatedPtrFieldInsertionIteratorsTest).nested_ptrs_.
                                  super__Vector_base<proto2_unittest::TestAllTypes_NestedMessage_*,_std::allocator<proto2_unittest::TestAllTypes_NestedMessage_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar1
                   );
  }
  lVar2 = 0x48;
  do {
    proto2_unittest::TestAllTypes_NestedMessage::~TestAllTypes_NestedMessage
              ((TestAllTypes_NestedMessage *)
               ((long)&(this->super_RepeatedPtrFieldInsertionIteratorsTest).super_Test._vptr_Test +
               lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_RepeatedPtrFieldInsertionIteratorsTest).words_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x3c0);
  return;
}

Assistant:

TEST_F(RepeatedPtrFieldInsertionIteratorsTest, MoveStrings) {
  std::vector<std::string> src = {"a", "b", "c", "d"};
  std::vector<std::string> copy =
      src;  // copy since move leaves in undefined state
  TestAllTypes testproto;
  std::move(copy.begin(), copy.end(),
            RepeatedFieldBackInserter(testproto.mutable_repeated_string()));

  ASSERT_THAT(testproto.repeated_string(), testing::ElementsAreArray(src));
}